

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgenericshape.cpp
# Opt level: O0

TPZTransform<double> * GetSideTransform<pzshape::TPZShapePoint>(int side,int trans_id)

{
  TPZFMatrix<double> *pTVar1;
  TPZFMatrix<double> *pTVar2;
  int in_ESI;
  TPZTransform<double> *in_RDI;
  TPZFMatrix<double> res1;
  TPZFMatrix<double> resul_mult;
  TPZTransform<double> TransParametric;
  MElementType type_side;
  TPZTransform<double> *TransElToSide;
  TPZTransform<double> *in_stack_fffffffffffff7d8;
  TPZTransform<double> *in_stack_fffffffffffff7e0;
  undefined8 in_stack_fffffffffffff7e8;
  int side_00;
  TPZFMatrix<double> *in_stack_fffffffffffff7f0;
  TPZFMatrix<double> *in_stack_fffffffffffff7f8;
  TPZFMatrix<double> *in_stack_fffffffffffff810;
  int in_stack_fffffffffffff818;
  int in_stack_fffffffffffff81c;
  TPZTransform<double> *this;
  TPZFMatrix<double> *in_stack_fffffffffffff830;
  int in_stack_fffffffffffff85c;
  int in_stack_fffffffffffff88c;
  undefined1 local_740 [148];
  undefined4 local_6ac;
  TPZTransform<double> local_1b8;
  byte local_15;
  MElementType local_14;
  
  side_00 = (int)((ulong)in_stack_fffffffffffff7e8 >> 0x20);
  this = in_RDI;
  local_14 = pztopology::TPZPoint::Type(in_ESI);
  local_15 = 0;
  pztopology::TPZPoint::TransformElementToSide(side_00);
  TPZTransform<double>::TPZTransform(in_RDI,in_stack_fffffffffffff81c,in_stack_fffffffffffff818);
  if (local_14 == EOned) {
    pzshape::TPZShapeLinear::ParametricTransform(1);
    TPZTransform<double>::operator=(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x186c962);
  }
  else if (local_14 == ETriangle) {
    pzshape::TPZShapeTriang::ParametricTransform(in_stack_fffffffffffff88c);
    TPZTransform<double>::operator=(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x186ca45);
  }
  else if (local_14 == EQuadrilateral) {
    pzshape::TPZShapeQuad::ParametricTransform(in_stack_fffffffffffff85c);
    TPZTransform<double>::operator=(in_stack_fffffffffffff7e0,in_stack_fffffffffffff7d8);
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x186c9e0);
  }
  TPZFMatrix<double>::TPZFMatrix(in_stack_fffffffffffff810);
  pTVar1 = TPZTransform<double>::Mult(&local_1b8);
  pTVar2 = TPZTransform<double>::Mult(this);
  (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar1,pTVar2,local_740,0);
  TPZTransform<double>::Mult(this);
  TPZFMatrix<double>::operator=(in_stack_fffffffffffff7f8,in_stack_fffffffffffff7f0);
  TPZFMatrix<double>::TPZFMatrix(pTVar1);
  pTVar1 = TPZTransform<double>::Mult(&local_1b8);
  pTVar2 = TPZTransform<double>::Sum(this);
  (*(pTVar1->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x25])
            (pTVar1,pTVar2,&stack0xfffffffffffff830,0);
  TPZTransform<double>::Sum(this);
  TPZFMatrix<double>::operator=(pTVar1,pTVar2);
  TPZTransform<double>::Sum(&local_1b8);
  TPZTransform<double>::Sum(this);
  TPZFMatrix<double>::operator+=(in_stack_fffffffffffff830,(TPZMatrix<double> *)this);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x186cbc8);
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x186cbd5);
  local_15 = 1;
  local_6ac = 1;
  TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x186cc3a);
  if ((local_15 & 1) == 0) {
    TPZTransform<double>::~TPZTransform((TPZTransform<double> *)0x186cc5f);
  }
  return in_RDI;
}

Assistant:

TPZTransform<REAL> GetSideTransform(const int side, int trans_id) {
    
    MElementType type_side = TSHAPE::Type(side);
    TPZTransform<REAL> TransElToSide = TSHAPE::TransformElementToSide(side);
    
    TPZTransform<REAL> TransParametric(1,1);
    switch (type_side) {
        case EOned:
        {
            TransParametric = pzshape::TPZShapeLinear::ParametricTransform(trans_id);
        }
            break;
        case EQuadrilateral:
        {
            TransParametric = pzshape::TPZShapeQuad::ParametricTransform(trans_id);
        }
            break;
        case ETriangle:
        {
            TransParametric = pzshape::TPZShapeTriang::ParametricTransform(trans_id);
        }
            break;
        default:
            break;
    }
    //why TSHAPE::Dimension>2 here??
    if ((side == TSHAPE::NSides - 1) && TSHAPE::Dimension>2) {
        
        return TransElToSide;
    }
    else{
        TPZFMatrix<REAL> resul_mult;
        TransParametric.Mult().Multiply(TransElToSide.Mult(), resul_mult);
        TransElToSide.Mult() = resul_mult;
        TPZFMatrix<REAL> res1;
        TransParametric.Mult().Multiply( TransElToSide.Sum(), res1);
        TransElToSide.Sum() =res1;
        TransElToSide.Sum() += TransParametric.Sum();
        
    }
    
    return TransElToSide;
    
}